

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::AsymSignInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  CK_MECHANISM_TYPE CVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Session *this_00;
  Token *pTVar9;
  OSObject *key;
  CK_STATE sessionState;
  CK_RV CVar10;
  CryptoFactory *pCVar11;
  SoftHSM *inAsymmetricCryptoOp;
  RSAPrivateKey *privateKey;
  CK_RV CVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar13;
  Type inMechanism;
  undefined4 uVar14;
  SoftHSM *pSVar15;
  char *format;
  undefined8 *inParam;
  size_t local_60;
  bool local_58;
  undefined8 local_48;
  long local_40;
  Token *local_38;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pMechanism == (CK_MECHANISM_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar7 = Session::getOpType(this_00);
  if (iVar7 != 0) {
    return 0x90;
  }
  pTVar9 = Session::getToken(this_00);
  if (pTVar9 == (Token *)0x0) goto LAB_00134b65;
  key = (OSObject *)HandleManager::getObject(this->handleManager,hKey);
  if (key == (OSObject *)0x0) {
    return 0x82;
  }
  iVar7 = (*key->_vptr_OSObject[10])(key);
  if ((char)iVar7 == '\0') {
    return 0x82;
  }
  local_38 = pTVar9;
  iVar7 = (*key->_vptr_OSObject[4])(key,1,0);
  iVar8 = (*key->_vptr_OSObject[4])(key,2,1);
  sessionState = Session::getState(this_00);
  CVar10 = haveRead(sessionState,(CK_BBOOL)iVar7,(CK_BBOOL)iVar8);
  if (CVar10 != 0) {
    if (CVar10 == 0x101) {
      softHSMLog(6,"AsymSignInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x1011,"User is not authorized");
      return 0x101;
    }
    return CVar10;
  }
  iVar7 = (*key->_vptr_OSObject[4])(key,0x108,0);
  if ((char)iVar7 == '\0') {
    return 0x68;
  }
  bVar6 = isMechanismPermitted(this,key,pMechanism);
  CVar10 = 0x70;
  if (!bVar6) {
    return 0x70;
  }
  CVar1 = pMechanism->mechanism;
  if ((long)CVar1 < 0x40) {
    switch(CVar1) {
    case 1:
      inMechanism = RSA_PKCS;
      goto LAB_00134752;
    default:
      goto switchD_00134619_caseD_2;
    case 3:
      inMechanism = RSA;
LAB_00134752:
      inParam = (undefined8 *)0x0;
      local_60 = 0;
LAB_0013475e:
      local_58 = false;
      goto LAB_001349f8;
    case 5:
      inMechanism = RSA_MD5_PKCS;
      goto LAB_001349ea;
    case 6:
      inMechanism = RSA_SHA1_PKCS;
      goto LAB_001349ea;
    case 0xd:
      plVar2 = (long *)pMechanism->pParameter;
      if ((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) {
        format = "Invalid RSA-PSS parameters";
        iVar7 = 0x105c;
        goto LAB_00134d22;
      }
      lVar13 = *plVar2;
      if (lVar13 < 0x255) {
        if (lVar13 == 0x220) {
          local_48._0_4_ = 2;
          lVar13 = 1;
          uVar14 = 1;
        }
        else {
          if (lVar13 != 0x250) {
LAB_00134e17:
            format = "Invalid RSA-PSS hash";
            iVar7 = 0x107d;
            goto LAB_00134d22;
          }
          local_48._0_4_ = 4;
          lVar13 = 2;
          uVar14 = 3;
        }
      }
      else if (lVar13 == 0x255) {
        local_48._0_4_ = 3;
        lVar13 = 5;
        uVar14 = 2;
      }
      else if (lVar13 == 0x260) {
        local_48._0_4_ = 5;
        lVar13 = 3;
        uVar14 = 4;
      }
      else {
        if (lVar13 != 0x270) goto LAB_00134e17;
        local_48._0_4_ = 6;
        lVar13 = 4;
        uVar14 = 5;
      }
      local_48 = CONCAT44(uVar14,(undefined4)local_48);
      if (plVar2[1] != lVar13) {
        format = "Hash and MGF don\'t match";
        iVar7 = 0x1082;
LAB_00134d22:
        softHSMLog(3,"AsymSignInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,iVar7,format);
        return 7;
      }
      local_40 = plVar2[2];
      inParam = &local_48;
      local_60 = 0x10;
      inMechanism = RSA_PKCS_PSS;
      goto LAB_0013475e;
    case 0xe:
      plVar2 = (long *)pMechanism->pParameter;
      if ((((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar2 != 0x220))
         || (plVar2[1] != 1)) {
        format = "Invalid parameters";
        iVar7 = 0x1093;
        goto LAB_00134d22;
      }
      local_48 = 0x100000002;
      local_40 = plVar2[2];
      inMechanism = RSA_SHA1_PKCS_PSS;
      goto LAB_001349d8;
    case 0x11:
      bVar3 = true;
      inMechanism = DSA;
      inParam = (undefined8 *)0x0;
      local_60 = 0;
      local_58 = false;
      bVar6 = false;
      goto LAB_001349fa;
    case 0x12:
      inMechanism = DSA_SHA1;
      break;
    case 0x13:
      inMechanism = DSA_SHA224;
      break;
    case 0x14:
      inMechanism = DSA_SHA256;
      break;
    case 0x15:
      inMechanism = DSA_SHA384;
      break;
    case 0x16:
      inMechanism = DSA_SHA512;
    }
    local_58 = true;
    inParam = (undefined8 *)0x0;
    local_60 = 0;
    bVar6 = false;
    bVar3 = true;
    goto LAB_001349fa;
  }
  switch(CVar1) {
  case 0x40:
    inMechanism = RSA_SHA256_PKCS;
    break;
  case 0x41:
    inMechanism = RSA_SHA384_PKCS;
    break;
  case 0x42:
    inMechanism = RSA_SHA512_PKCS;
    break;
  case 0x43:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x250 || (plVar2[1] != 2)))) {
      format = "Invalid parameters";
      iVar7 = 0x10b7;
      goto LAB_00134d22;
    }
    local_48 = 0x300000004;
    local_40 = plVar2[2];
    inMechanism = RSA_SHA256_PKCS_PSS;
    goto LAB_001349d8;
  case 0x44:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x260 || (plVar2[1] != 3)))) {
      format = "Invalid parameters";
      iVar7 = 0x10c9;
      goto LAB_00134d22;
    }
    local_48 = 0x400000005;
    local_40 = plVar2[2];
    inMechanism = RSA_SHA384_PKCS_PSS;
    goto LAB_001349d8;
  case 0x45:
    plVar2 = (long *)pMechanism->pParameter;
    if ((((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar2 != 0x270)) ||
       (plVar2[1] != 4)) {
      format = "Invalid parameters";
      iVar7 = 0x10db;
      goto LAB_00134d22;
    }
    local_48 = 0x500000006;
    local_40 = plVar2[2];
    inMechanism = RSA_SHA512_PKCS_PSS;
    goto LAB_001349d8;
  case 0x46:
    inMechanism = RSA_SHA224_PKCS;
    break;
  case 0x47:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x255 || (plVar2[1] != 5)))) {
      format = "Invalid parameters";
      iVar7 = 0x10a5;
      goto LAB_00134d22;
    }
    local_48 = 0x200000003;
    local_40 = plVar2[2];
    inMechanism = RSA_SHA224_PKCS_PSS;
LAB_001349d8:
    local_58 = true;
    local_60 = 0x10;
    inParam = &local_48;
    bVar3 = false;
    bVar6 = true;
    goto LAB_001349fa;
  default:
    if (CVar1 == 0x1041) {
      bVar4 = true;
      inMechanism = ECDSA;
      inParam = (undefined8 *)0x0;
      local_60 = 0;
      local_58 = false;
      bVar6 = false;
      bVar3 = false;
      goto LAB_001349fc;
    }
    if (CVar1 != 0x1057) {
      return 0x70;
    }
    bVar5 = true;
    inMechanism = EDDSA;
    inParam = (undefined8 *)0x0;
    local_60 = 0;
    local_58 = false;
    bVar6 = false;
    bVar3 = false;
    bVar4 = false;
    goto LAB_001349fe;
  }
LAB_001349ea:
  local_58 = true;
  inParam = (undefined8 *)0x0;
  local_60 = 0;
LAB_001349f8:
  bVar6 = true;
  bVar3 = false;
LAB_001349fa:
  bVar4 = false;
LAB_001349fc:
  bVar5 = false;
LAB_001349fe:
  if (bVar6) {
    pCVar11 = CryptoFactory::i();
    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,1);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var,iVar7);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar15 = inAsymmetricCryptoOp;
    iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
    privateKey = (RSAPrivateKey *)CONCAT44(extraout_var_00,iVar7);
    if (privateKey == (RSAPrivateKey *)0x0) goto LAB_00134b6f;
    CVar12 = getRSAPrivateKey(pSVar15,privateKey,local_38,key);
  }
  else if (bVar3) {
    pCVar11 = CryptoFactory::i();
    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,2);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_01,iVar7);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar15 = inAsymmetricCryptoOp;
    iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
    privateKey = (RSAPrivateKey *)CONCAT44(extraout_var_02,iVar7);
    if (privateKey == (RSAPrivateKey *)0x0) goto LAB_00134b6f;
    CVar12 = getDSAPrivateKey(pSVar15,(DSAPrivateKey *)privateKey,local_38,key);
  }
  else if (bVar4) {
    pCVar11 = CryptoFactory::i();
    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,5);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_03,iVar7);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar15 = inAsymmetricCryptoOp;
    iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
    privateKey = (RSAPrivateKey *)CONCAT44(extraout_var_04,iVar7);
    if (privateKey == (RSAPrivateKey *)0x0) {
LAB_00134b6f:
      pCVar11 = CryptoFactory::i();
      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,inAsymmetricCryptoOp);
      return 2;
    }
    CVar12 = getECPrivateKey(pSVar15,(ECPrivateKey *)privateKey,local_38,key);
  }
  else {
    if (!bVar5) {
      return 0x70;
    }
    pCVar11 = CryptoFactory::i();
    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,7);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_05,iVar7);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar15 = inAsymmetricCryptoOp;
    iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
    privateKey = (RSAPrivateKey *)CONCAT44(extraout_var_06,iVar7);
    if (privateKey == (RSAPrivateKey *)0x0) goto LAB_00134b6f;
    CVar12 = getEDPrivateKey(pSVar15,(EDPrivateKey *)privateKey,local_38,key);
  }
  if (CVar12 == 0) {
    if ((local_58 == false) ||
       (iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[3])
                          (inAsymmetricCryptoOp,privateKey,(ulong)inMechanism,inParam,local_60),
       (char)iVar7 != '\0')) {
      iVar7 = (*key->_vptr_OSObject[4])(key,0x202,0);
      if ((char)iVar7 != '\0') {
        Session::setReAuthentication(this_00,true);
      }
      Session::setOpType(this_00,5);
      Session::setAsymmetricCryptoOp(this_00,(AsymmetricAlgorithm *)inAsymmetricCryptoOp);
      Session::setMechanism(this_00,inMechanism);
      Session::setParameters(this_00,inParam,local_60);
      Session::setAllowMultiPartOp(this_00,local_58);
      Session::setAllowSinglePartOp(this_00,true);
      Session::setPrivateKey(this_00,&privateKey->super_PrivateKey);
      CVar10 = 0;
    }
    else {
      (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1b])(inAsymmetricCryptoOp,privateKey);
      pCVar11 = CryptoFactory::i();
      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,inAsymmetricCryptoOp);
    }
  }
  else {
    (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1b])(inAsymmetricCryptoOp,privateKey);
    pCVar11 = CryptoFactory::i();
    (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,inAsymmetricCryptoOp);
LAB_00134b65:
    CVar10 = 5;
  }
switchD_00134619_caseD_2:
  return CVar10;
}

Assistant:

CK_RV SoftHSM::AsymSignInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for signing
	if (!key->getBooleanValue(CKA_SIGN, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get the asymmetric algorithm matching the mechanism
	AsymMech::Type mechanism = AsymMech::Unknown;
	void* param = NULL;
	size_t paramLen = 0;
	RSA_PKCS_PSS_PARAMS pssParam;
	bool bAllowMultiPartOp;
	bool isRSA = false;
	bool isDSA = false;
#ifdef WITH_ECC
	bool isECDSA = false;
#endif
#ifdef WITH_EDDSA
	bool isEDDSA = false;
#endif
	switch(pMechanism->mechanism) {
		case CKM_RSA_PKCS:
			mechanism = AsymMech::RSA_PKCS;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
		case CKM_RSA_X_509:
			mechanism = AsymMech::RSA;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#ifndef WITH_FIPS
		case CKM_MD5_RSA_PKCS:
			mechanism = AsymMech::RSA_MD5_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA1_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA224_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA256_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA384_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA512_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#ifdef WITH_RAW_PSS
		case CKM_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS))
			{
				ERROR_MSG("Invalid RSA-PSS parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_PKCS_PSS;
			unsigned long allowedMgf;

			switch(CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg) {
				case CKM_SHA_1:
					pssParam.hashAlg = HashAlgo::SHA1;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
					allowedMgf = CKG_MGF1_SHA1;
					break;
				case CKM_SHA224:
					pssParam.hashAlg = HashAlgo::SHA224;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
					allowedMgf = CKG_MGF1_SHA224;
					break;
				case CKM_SHA256:
					pssParam.hashAlg = HashAlgo::SHA256;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
					allowedMgf = CKG_MGF1_SHA256;
					break;
				case CKM_SHA384:
					pssParam.hashAlg = HashAlgo::SHA384;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
					allowedMgf = CKG_MGF1_SHA384;
					break;
				case CKM_SHA512:
					pssParam.hashAlg = HashAlgo::SHA512;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
					allowedMgf = CKG_MGF1_SHA512;
					break;
				default:
					ERROR_MSG("Invalid RSA-PSS hash");
					return CKR_ARGUMENTS_BAD;
			}

			if (CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != allowedMgf) {
				ERROR_MSG("Hash and MGF don't match");
				return CKR_ARGUMENTS_BAD;
			}

			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA_1 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA1)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA1_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA1;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA224 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA224)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA224_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA224;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA256 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA256)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA256_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA256;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA384 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA384)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA384_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA384;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA512 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA512)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA512_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA512;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_DSA:
			mechanism = AsymMech::DSA;
			bAllowMultiPartOp = false;
			isDSA = true;
			break;
		case CKM_DSA_SHA1:
			mechanism = AsymMech::DSA_SHA1;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA224:
			mechanism = AsymMech::DSA_SHA224;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA256:
			mechanism = AsymMech::DSA_SHA256;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA384:
			mechanism = AsymMech::DSA_SHA384;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA512:
			mechanism = AsymMech::DSA_SHA512;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
#ifdef WITH_ECC
		case CKM_ECDSA:
			mechanism = AsymMech::ECDSA;
			bAllowMultiPartOp = false;
			isECDSA = true;
			break;
#endif
#ifdef WITH_GOST
		case CKM_GOSTR3410:
			mechanism = AsymMech::GOST;
			bAllowMultiPartOp = false;
			break;
		case CKM_GOSTR3410_WITH_GOSTR3411:
			mechanism = AsymMech::GOST_GOST;
			bAllowMultiPartOp = true;
			break;
#endif
#ifdef WITH_EDDSA
		case CKM_EDDSA:
			mechanism = AsymMech::EDDSA;
			bAllowMultiPartOp = false;
			isEDDSA = true;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}

	AsymmetricAlgorithm* asymCrypto = NULL;
	PrivateKey* privateKey = NULL;
	if (isRSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getRSAPrivateKey((RSAPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
	else if (isDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getDSAPrivateKey((DSAPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
        }
#ifdef WITH_ECC
	else if (isECDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getECPrivateKey((ECPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
#ifdef WITH_EDDSA
	else if (isEDDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::EDDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getEDPrivateKey((EDPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
	else
	{
#ifdef WITH_GOST
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getGOSTPrivateKey((GOSTPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
#else
		return CKR_MECHANISM_INVALID;
#endif
        }